

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

int tnt_iter_map_next(tnt_iter *i)

{
  tnt_iter_map *itr;
  tnt_iter *i_local;
  
  (i->data).map.cur_index = (i->data).map.cur_index + 1;
  if ((uint)(i->data).map.cur_index < (i->data).map.pair_count) {
    if ((i->data).map.cur_index == 0) {
      (i->data).array.elem = (i->data).array.first_elem;
    }
    else {
      (i->data).array.elem = (i->data).map.value_end;
    }
    (i->data).array.elem_end = (i->data).array.elem;
    mp_next(&(i->data).array.elem_end);
    (i->data).map.value = (i->data).array.elem_end;
    (i->data).map.value_end = (i->data).map.value;
    mp_next(&(i->data).map.value_end);
    i_local._4_4_ = 1;
  }
  else {
    i->status = TNT_ITER_FAIL;
    i_local._4_4_ = 0;
  }
  return i_local._4_4_;
}

Assistant:

static int tnt_iter_map_next(struct tnt_iter *i) {
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->cur_index++;
	if ((uint32_t)itr->cur_index >= itr->pair_count) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	if (itr->cur_index == 0)
		itr->key = itr->first_key;
	else
		itr->key = itr->value_end;
	itr->key_end = itr->key;
	mp_next(&itr->key_end);
	itr->value = itr->key_end;
	itr->value_end = itr->value;
	mp_next(&itr->value_end);
	return 1;

}